

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

int mpc_nparse(char *filename,char *string,size_t length,mpc_parser_t *p,mpc_result_t *r)

{
  int iVar1;
  mpc_input_t *i_00;
  mpc_input_t *i;
  int x;
  mpc_result_t *r_local;
  mpc_parser_t *p_local;
  size_t length_local;
  char *string_local;
  char *filename_local;
  
  i_00 = mpc_input_new_nstring(filename,string,length);
  iVar1 = mpc_parse_input(i_00,p,r);
  mpc_input_delete(i_00);
  return iVar1;
}

Assistant:

int mpc_nparse(const char *filename, const char *string, size_t length, mpc_parser_t *p, mpc_result_t *r) {
  int x;
  mpc_input_t *i = mpc_input_new_nstring(filename, string, length);
  x = mpc_parse_input(i, p, r);
  mpc_input_delete(i);
  return x;
}